

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

bool anon_unknown.dwarf_517558::VisitPreset<cmCMakePresetsGraph::PackagePreset>
               (PackagePreset *preset,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
               *presets,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                        *cycleStatus,cmCMakePresetsGraph *graph)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this;
  element_type *peVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  *this_00;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  iterator iVar6;
  size_type sVar7;
  _Rb_tree_node_base *p_Var8;
  key_type *__k;
  cmJSONState *state;
  string *__k_00;
  allocator<char> local_c9;
  __shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2> *local_c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
  *local_c0;
  cmCMakePresetsGraph *local_b8;
  string *local_b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  *local_a8;
  PackagePreset *local_a0;
  _Base_ptr local_98;
  key_type *local_90;
  key_type *local_88;
  key_type local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  local_60;
  
  __k_00 = &(preset->super_Preset).Name;
  local_c0 = &presets->_M_t;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
           ::operator[](cycleStatus,__k_00);
  bVar2 = true;
  if (*pmVar4 != Verified) {
    if (*pmVar4 == InProgress) {
      cmCMakePresetsErrors::CYCLIC_PRESET_INHERITANCE(__k_00,&graph->parseState);
    }
    else {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
               ::operator[](cycleStatus,__k_00);
      *pmVar4 = InProgress;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_c9);
      this = &(preset->super_Preset).Environment;
      sVar5 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::count(this,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      if ((sVar5 == 0) &&
         (iVar3 = (*(preset->super_Preset)._vptr_Preset[3])(preset), (char)iVar3 != '\0')) {
        local_90 = (preset->super_Preset).Inherits.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        local_98 = &(((_Rep_type *)&local_c0->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
        local_c8 = &(preset->super_Preset).ConditionEvaluator.
                    super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>;
        __k = (preset->super_Preset).Inherits.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        local_b8 = graph;
        local_b0 = __k_00;
        local_a8 = cycleStatus;
        local_a0 = preset;
        while (this_00 = local_a8, __k_00 = local_b0, graph = local_b8, __k != local_90) {
          local_88 = __k;
          iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
                  ::find(local_c0,__k);
          if (iVar6._M_node == local_98) goto LAB_00224510;
          sVar7 = std::
                  _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&(((preset->super_Preset).OriginFile)->ReachableFiles)._M_h,
                          (key_type *)&iVar6._M_node[4]._M_parent);
          if (sVar7 == 0) {
            cmCMakePresetsErrors::INHERITED_PRESET_UNREACHABLE_FROM_FILE(__k_00,&graph->parseState);
            goto LAB_0022451f;
          }
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::map(&local_60,this_00);
          bVar2 = VisitPreset<cmCMakePresetsGraph::PackagePreset>
                            ((PackagePreset *)(iVar6._M_node + 2),
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
                              *)local_c0,&local_60,graph);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          ::~map(&local_60);
          preset = local_a0;
          if (!bVar2) goto LAB_0022451f;
          iVar3 = (*(local_a0->super_Preset)._vptr_Preset[2])
                            (local_a0,(PackagePreset *)(iVar6._M_node + 2));
          if ((char)iVar3 == '\0') {
            state = &local_b8->parseState;
            __k_00 = local_b0;
            goto LAB_0022451a;
          }
          for (p_Var8 = *(_Rb_tree_node_base **)(iVar6._M_node + 8);
              p_Var8 != (_Rb_tree_node_base *)&iVar6._M_node[7]._M_left;
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
            ::
            _M_insert_unique<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>const&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                        *)this,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(p_Var8 + 1));
          }
          if (local_c8->_M_ptr == (element_type *)0x0) {
            std::__shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (local_c8,(__shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>
                                 *)&iVar6._M_node[6]._M_left);
          }
          __k = local_88 + 1;
        }
        peVar1 = ((__shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_c8->_M_ptr)->_M_ptr;
        if ((peVar1 != (element_type *)0x0) &&
           (iVar3 = (*peVar1->_vptr_Condition[3])(), (char)iVar3 != '\0')) {
          std::__shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>::reset
                    (local_c8);
        }
        state = &graph->parseState;
        iVar3 = (*(preset->super_Preset)._vptr_Preset[4])
                          (preset,(ulong)(uint)((preset->super_Preset).OriginFile)->Version,state);
        if ((char)iVar3 != '\0') {
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                   ::operator[](this_00,__k_00);
          *pmVar4 = Verified;
          return true;
        }
      }
      else {
LAB_00224510:
        state = &graph->parseState;
      }
LAB_0022451a:
      cmCMakePresetsErrors::INVALID_PRESET_NAMED(__k_00,state);
    }
LAB_0022451f:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool VisitPreset(
  T& preset,
  std::map<std::string, cmCMakePresetsGraph::PresetPair<T>>& presets,
  std::map<std::string, CycleStatus> cycleStatus, cmCMakePresetsGraph& graph)
{
  switch (cycleStatus[preset.Name]) {
    case CycleStatus::InProgress:
      cmCMakePresetsErrors::CYCLIC_PRESET_INHERITANCE(preset.Name,
                                                      &graph.parseState);
      return false;
    case CycleStatus::Verified:
      return true;
    default:
      break;
  }

  cycleStatus[preset.Name] = CycleStatus::InProgress;

  if (preset.Environment.count("") != 0) {
    cmCMakePresetsErrors::INVALID_PRESET_NAMED(preset.Name, &graph.parseState);
    return false;
  }

  bool result = preset.VisitPresetBeforeInherit();
  if (!result) {
    cmCMakePresetsErrors::INVALID_PRESET_NAMED(preset.Name, &graph.parseState);
    return false;
  }

  for (auto const& i : preset.Inherits) {
    auto parent = presets.find(i);
    if (parent == presets.end()) {
      cmCMakePresetsErrors::INVALID_PRESET_NAMED(preset.Name,
                                                 &graph.parseState);
      return false;
    }

    auto& parentPreset = parent->second.Unexpanded;
    if (!preset.OriginFile->ReachableFiles.count(parentPreset.OriginFile)) {
      cmCMakePresetsErrors::INHERITED_PRESET_UNREACHABLE_FROM_FILE(
        preset.Name, &graph.parseState);
      return false;
    }

    if (!VisitPreset(parentPreset, presets, cycleStatus, graph)) {
      return false;
    }

    result = preset.VisitPresetInherit(parentPreset);
    if (!result) {
      cmCMakePresetsErrors::INVALID_PRESET_NAMED(preset.Name,
                                                 &graph.parseState);
      return false;
    }

    for (auto const& v : parentPreset.Environment) {
      preset.Environment.insert(v);
    }

    if (!preset.ConditionEvaluator) {
      preset.ConditionEvaluator = parentPreset.ConditionEvaluator;
    }
  }

  if (preset.ConditionEvaluator && preset.ConditionEvaluator->IsNull()) {
    preset.ConditionEvaluator.reset();
  }

  result = preset.VisitPresetAfterInherit(graph.GetVersion(preset),
                                          &graph.parseState);
  if (!result) {
    cmCMakePresetsErrors::INVALID_PRESET_NAMED(preset.Name, &graph.parseState);
    return false;
  }

  cycleStatus[preset.Name] = CycleStatus::Verified;
  return true;
}